

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyDebugInfoForm
          (DWARFVerifier *this,DWARFDie *Die,DWARFAttribute *AttrValue)

{
  DWARFFormValue *this_00;
  Form FVar1;
  DWARFObject *pDVar2;
  DWARFUnit *this_01;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_02;
  uint64_t uVar8;
  undefined4 extraout_var;
  raw_ostream *prVar9;
  unsigned_long *puVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar11;
  long lVar12;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 *__v;
  char *Str;
  uint Encoding;
  StringRef SVar13;
  Optional<unsigned_long> OVar14;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_98;
  char *local_90;
  ulong local_88;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_80;
  Optional<unsigned_long> RefVal;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  Optional<unsigned_long> SecOffset;
  
  FVar1 = (AttrValue->Value).Form;
  Encoding = (uint)FVar1;
  uVar5 = 0;
  if (0x1a < FVar1 - 0xe) {
    return 0;
  }
  pDVar2 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  this_01 = Die->U;
  this_00 = &AttrValue->Value;
  switch((uint)FVar1) {
  case 0xe:
    OVar14 = DWARFFormValue::getAsSectionOffset(this_00);
    local_60 = OVar14.Storage.field_0;
    SecOffset.Storage.field_0.empty = OVar14.Storage.hasVal;
    if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("SecOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x249,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    puVar10 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                        ((OptionalStorage<unsigned_long,_true> *)&local_60);
    uVar3 = *puVar10;
    (*pDVar2->_vptr_DWARFObject[0x11])(pDVar2);
    if (uVar3 < extraout_RDX_00) {
      return 0;
    }
    prVar9 = error(this);
    Str = "DW_FORM_strp offset beyond .debug_str bounds:\n";
    goto LAB_00b4b718;
  default:
    goto switchD_00b4b35e_caseD_f;
  case 0x10:
    OVar14 = DWARFFormValue::getAsReference(this_00);
    local_60 = OVar14.Storage.field_0;
    SecOffset.Storage.field_0.empty = OVar14.Storage.hasVal;
    if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("RefVal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x238,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    puVar10 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                        ((OptionalStorage<unsigned_long,_true> *)&local_60);
    if (*puVar10 < (this_01->InfoSection->Data).Length) {
      puVar10 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                          ((OptionalStorage<unsigned_long,_true> *)&local_60);
      this_02 = &std::
                 map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::operator[](&this->ReferenceToDIEOffsets,puVar10)->_M_t;
      uVar7 = DWARFDie::getOffset(Die);
      __v = &local_98;
LAB_00b4b3c6:
      __v->value = uVar7;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_insert_unique<unsigned_long>(this_02,&__v->value);
      return 0;
    }
    prVar9 = error(this);
    Str = "DW_FORM_ref_addr offset beyond .debug_info bounds:\n";
LAB_00b4b718:
    raw_ostream::operator<<(prVar9,Str);
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    OVar14 = DWARFFormValue::getAsReference(this_00);
    local_80 = OVar14.Storage.field_0;
    RefVal.Storage.field_0.empty = OVar14.Storage.hasVal;
    if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("RefVal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x220,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    uVar7 = DWARFUnitHeader::getNextUnitOffset(&this_01->Header);
    uVar11 = uVar7 - (this_01->Header).Offset;
    uVar3 = (AttrValue->Value).Value.field_0.uval;
    if (uVar3 < uVar11) {
      puVar10 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                          ((OptionalStorage<unsigned_long,_true> *)&local_80);
      this_02 = &std::
                 map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::operator[](&this->ReferenceToDIEOffsets,puVar10)->_M_t;
      uVar7 = DWARFDie::getOffset(Die);
      __v = &local_60;
      goto LAB_00b4b3c6;
    }
    prVar9 = error(this);
    SVar13 = dwarf::FormEncodingString(Encoding);
    prVar9 = raw_ostream::operator<<(prVar9,SVar13);
    prVar9 = raw_ostream::operator<<(prVar9," CU offset ");
    SecOffset.Storage.field_0.value = (long)"String: 0x%08lx" + 8;
    local_60.value = (unsigned_long)&PTR_home_00e22798;
    SecOffset.Storage._8_8_ = uVar3;
    prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)&local_60);
    prVar9 = raw_ostream::operator<<(prVar9," is invalid (must be less than CU size of ");
    local_90 = "0x%08lx";
    local_98.value = (unsigned_long)&PTR_home_00e22798;
    local_88 = uVar11;
    prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)&local_98);
    raw_ostream::operator<<(prVar9,"):\n");
    DWARFDie::dump(Die,this->OS,0,this->DumpOpts);
    break;
  case 0x1a:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    if ((this_01->StringOffsetsTableContribution).Storage.hasVal == false) {
      prVar9 = error(this);
      SVar13 = dwarf::FormEncodingString(Encoding);
      prVar9 = raw_ostream::operator<<(prVar9,SVar13);
      raw_ostream::operator<<(prVar9," used without a valid string offsets table:\n");
    }
    else {
      uVar7 = (AttrValue->Value).Value.field_0.uval;
      bVar4 = DWARFUnit::getDwarfStringOffsetsByteSize(this_01);
      uVar8 = DWARFUnit::getStringOffsetsBase(this_01);
      RefVal.Storage._8_8_ = ZEXT18(bVar4);
      lVar12 = uVar7 * RefVal.Storage._8_8_;
      iVar6 = (*pDVar2->_vptr_DWARFObject[0x19])(pDVar2);
      SecOffset.Storage._8_8_ = uVar7;
      if (*(ulong *)(CONCAT44(extraout_var,iVar6) + 8) < uVar8 + RefVal.Storage._8_8_ + lVar12) {
        prVar9 = error(this);
        SVar13 = dwarf::FormEncodingString(Encoding);
        prVar9 = raw_ostream::operator<<(prVar9,SVar13);
        prVar9 = raw_ostream::operator<<(prVar9," uses index ");
        SecOffset.Storage.field_0.value = (unsigned_long)anon_var_dwarf_2ebeb6b;
        local_60.value = (unsigned_long)&PTR_home_00e22798;
        prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)&local_60);
        raw_ostream::operator<<(prVar9,", which is too large:\n");
      }
      else {
        OVar14 = DWARFUnit::getStringOffsetSectionItem(this_01,(uint32_t)uVar7);
        local_60 = OVar14.Storage.field_0;
        SecOffset.Storage.field_0.empty = OVar14.Storage.hasVal;
        puVar10 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                            ((OptionalStorage<unsigned_long,_true> *)&local_60);
        uVar3 = *puVar10;
        (*pDVar2->_vptr_DWARFObject[0x11])();
        if (uVar3 < extraout_RDX) {
          return 0;
        }
        prVar9 = error(this);
        SVar13 = dwarf::FormEncodingString(Encoding);
        prVar9 = raw_ostream::operator<<(prVar9,SVar13);
        prVar9 = raw_ostream::operator<<(prVar9," uses index ");
        SecOffset.Storage.field_0.value = (unsigned_long)anon_var_dwarf_2ebeb6b;
        local_60.value = (unsigned_long)&PTR_home_00e22798;
        prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)&local_60);
        raw_ostream::operator<<
                  (prVar9,", but the referenced string offset is beyond .debug_str bounds:\n");
      }
    }
  }
  prVar9 = dump(this,Die,0);
  raw_ostream::operator<<(prVar9,'\n');
  uVar5 = 1;
switchD_00b4b35e_caseD_f:
  return uVar5;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoForm(const DWARFDie &Die,
                                            DWARFAttribute &AttrValue) {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  auto DieCU = Die.getDwarfUnit();
  unsigned NumErrors = 0;
  const auto Form = AttrValue.Value.getForm();
  switch (Form) {
  case DW_FORM_ref1:
  case DW_FORM_ref2:
  case DW_FORM_ref4:
  case DW_FORM_ref8:
  case DW_FORM_ref_udata: {
    // Verify all CU relative references are valid CU offsets.
    Optional<uint64_t> RefVal = AttrValue.Value.getAsReference();
    assert(RefVal);
    if (RefVal) {
      auto CUSize = DieCU->getNextUnitOffset() - DieCU->getOffset();
      auto CUOffset = AttrValue.Value.getRawUValue();
      if (CUOffset >= CUSize) {
        ++NumErrors;
        error() << FormEncodingString(Form) << " CU offset "
                << format("0x%08" PRIx64, CUOffset)
                << " is invalid (must be less than CU size of "
                << format("0x%08" PRIx64, CUSize) << "):\n";
        Die.dump(OS, 0, DumpOpts);
        dump(Die) << '\n';
      } else {
        // Valid reference, but we will verify it points to an actual
        // DIE later.
        ReferenceToDIEOffsets[*RefVal].insert(Die.getOffset());
      }
    }
    break;
  }
  case DW_FORM_ref_addr: {
    // Verify all absolute DIE references have valid offsets in the
    // .debug_info section.
    Optional<uint64_t> RefVal = AttrValue.Value.getAsReference();
    assert(RefVal);
    if (RefVal) {
      if (*RefVal >= DieCU->getInfoSection().Data.size()) {
        ++NumErrors;
        error() << "DW_FORM_ref_addr offset beyond .debug_info "
                   "bounds:\n";
        dump(Die) << '\n';
      } else {
        // Valid reference, but we will verify it points to an actual
        // DIE later.
        ReferenceToDIEOffsets[*RefVal].insert(Die.getOffset());
      }
    }
    break;
  }
  case DW_FORM_strp: {
    auto SecOffset = AttrValue.Value.getAsSectionOffset();
    assert(SecOffset); // DW_FORM_strp is a section offset.
    if (SecOffset && *SecOffset >= DObj.getStrSection().size()) {
      ++NumErrors;
      error() << "DW_FORM_strp offset beyond .debug_str bounds:\n";
      dump(Die) << '\n';
    }
    break;
  }
  case DW_FORM_strx:
  case DW_FORM_strx1:
  case DW_FORM_strx2:
  case DW_FORM_strx3:
  case DW_FORM_strx4: {
    auto Index = AttrValue.Value.getRawUValue();
    auto DieCU = Die.getDwarfUnit();
    // Check that we have a valid DWARF v5 string offsets table.
    if (!DieCU->getStringOffsetsTableContribution()) {
      ++NumErrors;
      error() << FormEncodingString(Form)
              << " used without a valid string offsets table:\n";
      dump(Die) << '\n';
      break;
    }
    // Check that the index is within the bounds of the section.
    unsigned ItemSize = DieCU->getDwarfStringOffsetsByteSize();
    // Use a 64-bit type to calculate the offset to guard against overflow.
    uint64_t Offset =
        (uint64_t)DieCU->getStringOffsetsBase() + Index * ItemSize;
    if (DObj.getStrOffsetsSection().Data.size() < Offset + ItemSize) {
      ++NumErrors;
      error() << FormEncodingString(Form) << " uses index "
              << format("%" PRIu64, Index) << ", which is too large:\n";
      dump(Die) << '\n';
      break;
    }
    // Check that the string offset is valid.
    uint64_t StringOffset = *DieCU->getStringOffsetSectionItem(Index);
    if (StringOffset >= DObj.getStrSection().size()) {
      ++NumErrors;
      error() << FormEncodingString(Form) << " uses index "
              << format("%" PRIu64, Index)
              << ", but the referenced string"
                 " offset is beyond .debug_str bounds:\n";
      dump(Die) << '\n';
    }
    break;
  }
  default:
    break;
  }
  return NumErrors;
}